

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NearestNeighborsIndex::SerializeWithCachedSizes
          (NearestNeighborsIndex *this,CodedOutputStream *output)

{
  bool bVar1;
  int32 iVar2;
  uint uVar3;
  FloatVector *value;
  uint local_20;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  NearestNeighborsIndex *this_local;
  
  iVar2 = numberofdimensions(this);
  if (iVar2 != 0) {
    iVar2 = numberofdimensions(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(1,iVar2,output);
  }
  local_20 = 0;
  uVar3 = floatsamples_size(this);
  for (; local_20 < uVar3; local_20 = local_20 + 1) {
    value = floatsamples(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteMessage(2,&value->super_MessageLite,output);
  }
  bVar1 = has_linearindex(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (100,&((this->IndexType_).linearindex_)->super_MessageLite,output);
  }
  bVar1 = has_singlekdtreeindex(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x6e,&((this->IndexType_).linearindex_)->super_MessageLite,output);
  }
  bVar1 = has_squaredeuclideandistance(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (200,&((this->DistanceFunction_).squaredeuclideandistance_)->super_MessageLite,output)
    ;
  }
  return;
}

Assistant:

void NearestNeighborsIndex::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.NearestNeighborsIndex)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int32 numberOfDimensions = 1;
  if (this->numberofdimensions() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(1, this->numberofdimensions(), output);
  }

  // repeated .CoreML.Specification.FloatVector floatSamples = 2;
  for (unsigned int i = 0, n = this->floatsamples_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, this->floatsamples(i), output);
  }

  // .CoreML.Specification.LinearIndex linearIndex = 100;
  if (has_linearindex()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      100, *IndexType_.linearindex_, output);
  }

  // .CoreML.Specification.SingleKdTreeIndex singleKdTreeIndex = 110;
  if (has_singlekdtreeindex()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      110, *IndexType_.singlekdtreeindex_, output);
  }

  // .CoreML.Specification.SquaredEuclideanDistance squaredEuclideanDistance = 200;
  if (has_squaredeuclideandistance()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      200, *DistanceFunction_.squaredeuclideandistance_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.NearestNeighborsIndex)
}